

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::anon_unknown_0::ReconstructGPrimProperties
               (Specifier *spec,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *properties,GPrim *gprim,string *warn,string *err,
               bool strict_allowedToken_check)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr *rel;
  uint uVar2;
  string *psVar3;
  AttrMetas *pAVar4;
  size_type sVar5;
  undefined1 uVar6;
  size_type sVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  storage_t<double> *psVar12;
  const_iterator cVar13;
  _Base_ptr p_Var14;
  uint *args;
  MaterialBinding *mb;
  Collection *coll;
  size_type __n;
  char *pcVar15;
  storage_t<double> sVar16;
  char *pcVar17;
  undefined8 uVar18;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *args_1;
  bool bVar19;
  bool bVar20;
  ParseResult ret;
  string attr_type_name;
  Attribute *attr;
  ostringstream ss_e;
  storage_t<double> local_548;
  storage_t<double> sStack_540;
  storage_t<double> local_538;
  storage_t<double> sStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  storage_t<tinyusdz::Token> local_510;
  storage_t<double> local_4f0;
  storage_t<double> local_4e8;
  storage_t<double> local_4e0 [2];
  storage_t<double> local_4d0;
  uint local_4c4;
  string *local_4c0;
  storage_t<double> local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b0;
  _Base_ptr local_4a8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_4a0;
  storage_t<double> local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_490;
  AttrMetas *local_488;
  AttrMetas *local_480;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_478;
  Path *local_470;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_468;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_460;
  AttrMetas *local_458;
  string local_450;
  storage_t<double> local_430;
  storage_union local_428;
  undefined1 local_418 [16];
  undefined1 local_408 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  ios_base local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  storage_t<double> local_398;
  storage_t<tinyusdz::Token> local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [2];
  undefined1 local_348 [32];
  AttrMetas local_328;
  bool local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  uint uStack_e4;
  RelationshipProperty *local_d8;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_d0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_c8;
  _Rb_tree_node_base *local_c0;
  string local_b8;
  _Any_data local_98;
  storage_t<double> local_88;
  code *pcStack_80;
  _Any_data local_78;
  storage_t<double> local_68;
  code *pcStack_60;
  _Any_data local_58;
  storage_t<double> local_48;
  code *pcStack_40;
  
  bVar9 = ReconstructXformOpsFromProperties
                    (spec,table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)gprim,err);
  if (bVar9) {
    mb = &gprim->super_MaterialBinding;
    if (gprim == (GPrim *)0x0) {
      mb = (MaterialBinding *)0x0;
    }
    bVar9 = ReconstructMaterialBindingProperties(table,properties,mb,err);
    if (bVar9) {
      coll = &gprim->super_Collection;
      if (gprim == (GPrim *)0x0) {
        coll = (Collection *)0x0;
      }
      local_4c4 = (uint)strict_allowedToken_check;
      args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)err;
      bVar9 = ReconstructCollectionProperties
                        (table,properties,coll,warn,err,strict_allowedToken_check);
      if (bVar9) {
        p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
        bVar9 = p_Var14 == local_c0;
        if (bVar9) {
          return bVar9;
        }
        local_4a8 = (_Base_ptr)&(table->_M_t)._M_impl.super__Rb_tree_header;
        local_d8 = &gprim->proxyPrim;
        local_470 = &(gprim->proxyPrim)._relationship.targetPath;
        local_478 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_348;
        local_480 = &(gprim->proxyPrim)._relationship._metas;
        local_488 = &local_328;
        local_490 = local_368;
        args = (uint *)&local_388;
        local_4b0 = &local_3a8;
        local_458 = &(gprim->doubleSided)._metas;
        local_c8 = &(gprim->doubleSided)._paths;
        local_d0 = &gprim->extent;
        local_4a0 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                    &gprim->orientation;
        local_468 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                    &gprim->purpose;
        local_460 = &gprim->visibility;
        local_510._16_8_ = table;
        local_510._24_8_ = err;
        local_4c0 = warn;
        local_4b8 = (storage_t<double>)gprim;
        local_498 = (storage_t<double>)args;
        do {
          p_Var1 = p_Var14 + 1;
          iVar10 = ::std::__cxx11::string::compare((char *)p_Var1);
          if (iVar10 != 0) goto LAB_001ecc5f;
          local_428.dynamic = local_418;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"proxyPrim","");
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_510._16_8_,(key_type *)&local_428);
          if ((undefined1 *)local_428.dynamic != local_418) {
            operator_delete(local_428.dynamic,local_418._0_8_ + 1);
          }
          uVar18 = local_510._24_8_;
          iVar10 = 3;
          if (cVar13._M_node != local_4a8) goto LAB_001ef0ab;
          if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_428,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_428,0xabd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            local_520._M_allocated_capacity = (size_type)&local_510;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_520,"Property `{}` must be a Relationship.","");
            fmt::format<char_const*>
                      ((string *)&local_548,(fmt *)local_520._M_local_buf,(string *)&kProxyPrim,
                       (char **)args);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,(char *)local_548,(long)sStack_540);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            uVar18 = local_510._24_8_;
            if (local_548 != (storage_t<double>)&local_538) {
              operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
            }
            if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
              operator_delete((void *)local_520._M_allocated_capacity,
                              (ulong)((long)local_510.data._0_8_ + 1));
            }
            if ((string *)uVar18 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              psVar12 = (storage_t<double> *)
                        ::std::__cxx11::string::_M_append(local_520._M_local_buf,*(ulong *)uVar18);
              args = (uint *)(psVar12 + 2);
              if (*psVar12 == (storage_t<double>)args) {
                local_538 = *(storage_t<double> *)args;
                sStack_530 = psVar12[3];
                local_548 = (storage_t<double>)&local_538;
              }
              else {
                local_538 = *(storage_t<double> *)args;
                local_548 = *psVar12;
              }
              sStack_540 = psVar12[1];
              *psVar12 = (storage_t<double>)args;
              psVar12[1] = (storage_t<double>)0x0;
              *(undefined1 *)(psVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar18,(string *)&local_548);
              if (local_548 != (storage_t<double>)&local_538) {
                operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
              }
              if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                operator_delete((void *)local_520._M_allocated_capacity,
                                (ulong)((long)local_510.data._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
            ::std::ios_base::~ios_base(local_3b8);
            iVar10 = 1;
            goto LAB_001ef0ab;
          }
          if (3 < *(uint *)&p_Var14[0x17]._M_left) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_428,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_428,0xabd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            pcVar17 = "Internal error. Property `{}` is not a valid Relationship.";
            pcVar15 = "";
LAB_001edad6:
            local_520._M_allocated_capacity = (size_type)&local_510;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,pcVar17,pcVar15);
            fmt::format<char_const*>
                      ((string *)&local_548,(fmt *)local_520._M_local_buf,(string *)&kProxyPrim,
                       (char **)args);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,(char *)local_548,(long)sStack_540);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (local_548 != (storage_t<double>)&local_538) {
              operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
            }
            if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
              operator_delete((void *)local_520._M_allocated_capacity,
                              (ulong)((long)local_510.data._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar18 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_548,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_520,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               uVar18);
              ::std::__cxx11::string::operator=((string *)uVar18,(string *)&local_548);
              if (local_548 != (storage_t<double>)&local_538) {
                operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
              }
              if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                operator_delete((void *)local_520._M_allocated_capacity,
                                (ulong)((long)local_510.data._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
            ::std::ios_base::~ios_base(local_3b8);
            iVar10 = 1;
            goto LAB_001edbe4;
          }
          rel = &p_Var14[0x17]._M_left;
          args = &switchD_001ecdbe::switchdataD_003bab40;
          switch(*(uint *)&p_Var14[0x17]._M_left) {
          case 0:
            RelationshipProperty::RelationshipProperty
                      ((RelationshipProperty *)&local_428,(Relationship *)rel);
            sVar16 = local_4b8;
            *(undefined1 *)((long)local_4b8 + 0x1660) = local_428._0_1_;
            ((Relationship *)((long)local_4b8 + 0x1668))->type = local_428._8_4_;
            Path::operator=(local_470,(Path *)local_418);
            local_548 = *(storage_t<double> *)((long)sVar16 + 0x1740);
            sStack_540 = *(storage_t<double> *)((long)sVar16 + 0x1748);
            local_538 = *(storage_t<double> *)((long)sVar16 + 0x1750);
            *(undefined8 *)((long)sVar16 + 0x1740) = local_348._0_8_;
            *(undefined8 *)((long)sVar16 + 0x1748) = local_348._8_8_;
            *(undefined8 *)((long)sVar16 + 0x1750) = local_348._16_8_;
            args = (uint *)0x0;
            local_348._0_8_ = (pointer)0x0;
            local_348._8_8_ = (pointer)0x0;
            local_348._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_548);
            pAVar4 = local_488;
            *(undefined4 *)((long)sVar16 + 0x1758) = local_348._24_4_;
            AttrMetas::operator=(local_480,local_488);
            *(bool *)((long)sVar16 + 0x1968) = local_120;
            AttrMetas::~AttrMetas(pAVar4);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_478);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._16_8_ != local_490) {
              operator_delete((void *)local_388._16_8_,local_368[0]._M_allocated_capacity + 1);
            }
            if (local_398 != local_498) {
              operator_delete((void *)local_398,(long)local_388.data._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._0_8_ != local_4b0) {
              operator_delete((void *)local_3b8._0_8_,local_3a8._M_allocated_capacity + 1);
            }
            if ((storage_t<double> *)local_3d8._M_p != (storage_t<double> *)&local_3c8) {
              operator_delete(local_3d8._M_p,local_3c8._M_allocated_capacity + 1);
            }
            if ((storage_t<double> *)local_408._16_8_ != (storage_t<double> *)&local_3e8) {
              operator_delete((void *)local_408._16_8_,local_3e8._M_allocated_capacity + 1);
            }
            if ((storage_t<double> *)local_418._0_8_ != (storage_t<double> *)local_408) {
              operator_delete((void *)local_418._0_8_,local_408._0_8_ + 1);
            }
            break;
          case 1:
            goto switchD_001ecdbe_caseD_1;
          case 2:
            if ((long)p_Var14[0x1e]._M_left - (long)p_Var14[0x1e]._M_parent != 0xd0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_428,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_428,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_428,0xabd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              pcVar17 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
              pcVar15 = "";
              goto LAB_001edad6;
            }
            goto switchD_001ecdbe_caseD_1;
          case 3:
            RelationshipProperty::RelationshipProperty
                      ((RelationshipProperty *)&local_428,(Relationship *)rel);
            RelationshipProperty::operator=(local_d8,(RelationshipProperty *)&local_428);
            RelationshipProperty::~RelationshipProperty((RelationshipProperty *)&local_428);
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_510._16_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
          iVar10 = 0;
          bVar19 = true;
LAB_001edbe6:
          if (bVar19) {
LAB_001ecc5f:
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"doubleSided","")
            ;
            sVar7 = local_118._M_string_length;
            sVar5 = local_450._M_string_length;
            sStack_540 = (storage_t<double>)&sStack_530;
            local_538 = (storage_t<double>)0x0;
            sStack_530 = (storage_t<double>)((ulong)sStack_530 & 0xffffffffffffff00);
            __n = local_118._M_string_length;
            if (local_450._M_string_length < local_118._M_string_length) {
              __n = local_450._M_string_length;
            }
            if (__n == 0) {
              bVar19 = true;
            }
            else {
              iVar10 = bcmp(local_118._M_dataplus._M_p,local_450._M_dataplus._M_p,__n);
              bVar19 = iVar10 == 0;
            }
            local_4d0 = (storage_t<double>)(p_Var14 + 2);
            pcVar15._1_7_ = local_4d0._1_7_;
            pcVar15._0_1_ = sVar7 != sVar5;
            if ((bool)(bVar19 ^ 1U | sVar7 != sVar5)) {
              local_548._0_4_ = 1;
            }
            else {
              if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                local_548._0_4_ = 7;
                local_4f0 = (storage_t<double>)&DAT_0000003e;
                local_520._M_allocated_capacity = (size_type)&local_510;
                local_520._M_allocated_capacity =
                     ::std::__cxx11::string::_M_create
                               (&local_520._M_allocated_capacity,(ulong)&local_4f0);
                local_510.data.__align = (anon_struct_8_0_00000001_for___align)local_4f0;
                *(undefined8 *)local_520._M_allocated_capacity = 0x79747265706f7250;
                *(undefined8 *)(local_520._M_allocated_capacity + 8) = 0x756d20607d7b6020;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x10) = 0x7441206562207473;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x18) = 0x2c65747562697274;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x20) = 0x6365642074756220;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x28) = 0x736120646572616c;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x2e) = 0x74616c6552207361;
                *(undefined8 *)(local_520._M_allocated_capacity + 0x36) = 0x2e706968736e6f69;
                local_520._8_8_ = local_4f0;
                *(char *)((long)local_4f0 + local_520._M_allocated_capacity) = '\0';
                fmt::format<std::__cxx11::string>
                          ((string *)&local_428,(fmt *)local_520._M_local_buf,&local_450,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4f0);
                ::std::__cxx11::string::operator=((string *)&sStack_540,(string *)&local_428);
                if ((undefined1 *)local_428.dynamic != local_418) {
                  operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                }
                if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                  operator_delete((void *)local_520._M_allocated_capacity,
                                  (ulong)((long)local_510.data._0_8_ + 1));
                }
              }
              Attribute::type_name_abi_cxx11_((string *)&local_520,(Attribute *)local_4d0);
              local_428.dynamic = local_418;
              local_428._8_8_ = 4;
              local_418._0_5_ = 0x6c6f6f62;
              if ((storage_t<double>)local_520._8_8_ == (storage_t<double>)0x4) {
                bVar19 = *(int *)local_520._M_allocated_capacity == 0x6c6f6f62;
              }
              else {
                bVar19 = false;
              }
              bVar20 = true;
              pcVar15 = (char *)local_520._8_8_;
              if (!bVar19) {
                local_f8 = &local_e8;
                local_e8 = 0x6c6f6f62;
                local_f0 = 4;
                uStack_e4 = uStack_e4 & 0xffffff00;
                if ((storage_t<double>)local_520._8_8_ == (storage_t<double>)0x4) {
                  bVar20 = *(int *)local_520._M_allocated_capacity == 0x6c6f6f62;
                  pcVar15 = (char *)local_520._M_allocated_capacity;
                }
                else {
                  bVar20 = false;
                }
              }
              if ((!bVar19) && (local_f8 != &local_e8)) {
                operator_delete(local_f8,CONCAT44(uStack_e4,local_e8) + 1);
              }
              if ((undefined1 *)local_428.dynamic != local_418) {
                operator_delete(local_428.dynamic,local_418._0_8_ + 1);
              }
              if (bVar20) {
                if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_c8,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var14[6]._M_parent);
                  AttrMetas::operator=(local_458,(AttrMetas *)(p_Var14 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_510._16_8_,&local_118);
                  local_548 = (storage_t<double>)((ulong)local_548 & 0xffffffff00000000);
                }
                iVar10 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
                if (iVar10 == 1) {
                  if (p_Var14[3]._M_color == _S_black) {
                    if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                      if (p_Var14[4]._M_right == (_Base_ptr)0x0) {
                        bVar19 = false;
                      }
                      else {
                        iVar10 = (**(code **)p_Var14[4]._M_right)();
                        bVar19 = iVar10 == 4;
                      }
                      if ((bVar19) || ((p_Var14[5]._M_color & _S_black) != _S_red)) {
                        *(bool *)((long)local_4b8 + 0xf64) = true;
                        goto LAB_001ed24d;
                      }
                    }
                    if (((char)p_Var14[5]._M_color == _S_red) &&
                       (((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                         (iVar10 = (**(code **)p_Var14[4]._M_right)(), iVar10 == 0)) ||
                        ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                         (iVar10 = (**(code **)p_Var14[4]._M_right)(), iVar10 == 1)))))) {
                      local_548._0_4_ = 4;
                      ::std::__cxx11::string::operator=
                                ((string *)&sStack_540,
                                 "TimeSample or corrupted value assigned to a property where `uniform` variability is set."
                                );
                    }
                    else {
                      primvar::PrimVar::get_value<bool>((PrimVar *)&local_428);
                      uVar6 = local_428._0_1_;
                      if ((stringstream)local_428._0_1_ == (stringstream)0x1) {
                        pcVar15 = (char *)local_4b8;
                        if (*(char *)((long)local_4b8 + 0xf60) == '\0') {
                          *(undefined1 *)((long)local_4b8 + 0xf61) = local_428._1_1_;
                          *(char *)((long)local_4b8 + 0xf60) = '\x01';
                        }
                        else {
                          *(undefined1 *)((long)local_4b8 + 0xf61) = local_428._1_1_;
                        }
                      }
                      else {
                        local_548._0_4_ = 8;
                        ::std::__cxx11::string::operator=
                                  ((string *)&sStack_540,"Internal data corrupsed.");
                      }
                      if ((stringstream)uVar6 != (stringstream)0x0) goto LAB_001ed24d;
                    }
                  }
                  else {
                    local_548._0_4_ = 4;
                    local_4f0 = (storage_t<double>)local_4e0;
                    local_430 = (storage_t<double>)0x2d;
                    local_4f0 = (storage_t<double>)
                                ::std::__cxx11::string::_M_create
                                          ((ulong *)&local_4f0,(ulong)&local_430);
                    local_4e0[0] = local_430;
                    *(undefined8 *)local_4f0 = 0x7475626972747441;
                    *(undefined8 *)((long)local_4f0 + 8) = 0x6d20607d7b602065;
                    *(undefined8 *)((long)local_4f0 + 0x10) = 0x6020656220747375;
                    *(undefined8 *)((long)local_4f0 + 0x18) = 0x606d726f66696e75;
                    builtin_strncpy((char *)((long)local_4f0 + 0x1d),"rm` vari",8);
                    builtin_strncpy((char *)((long)local_4f0 + 0x25),"ability.",8);
                    local_4e8 = local_430;
                    *(char *)((long)local_4f0 + (long)local_430) = '\0';
                    pcVar15 = (char *)local_430;
                    fmt::format<std::__cxx11::string>
                              ((string *)&local_428,(fmt *)&local_4f0,&local_450,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_430);
                    ::std::__cxx11::string::operator=((string *)&sStack_540,(string *)&local_428);
                    if ((undefined1 *)local_428.dynamic != local_418) {
                      operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                    }
                    if (local_4f0 != (storage_t<double>)local_4e0) {
                      operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                    }
                  }
                }
                else if (iVar10 == 0) {
                  *(bool *)((long)local_4b8 + 0xf62) = true;
LAB_001ed24d:
                  AttrMetas::operator=(local_458,(AttrMetas *)(p_Var14 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_510._16_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_450);
                  local_548 = (storage_t<double>)((ulong)local_548 & 0xffffffff00000000);
                }
                else {
                  args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>
                            *)0x25;
                  pcVar15 = "Invalid Property type(internal error)";
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&sStack_540,0,(char *)local_538,0x3bcc94);
                  local_548._0_4_ = 8;
                }
              }
              else {
                local_548._0_4_ = 3;
                ::std::__cxx11::stringstream::stringstream((stringstream *)&local_428);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_418,"Property type mismatch. ",0x18);
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_418,local_450._M_dataplus._M_p,
                                     local_450._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," expects type `",0xf);
                local_4e8 = (storage_t<double>)0x4;
                local_4e0[0]._0_5_ = 0x6c6f6f62;
                local_4f0 = (storage_t<double>)local_4e0;
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_4e0,4);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"` but defined as type `",0x17);
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_520._M_allocated_capacity,local_520._8_8_
                                    );
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"`",1);
                if (local_4f0 != (storage_t<double>)local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                }
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::operator=((string *)&sStack_540,(string *)&local_4f0);
                if (local_4f0 != (storage_t<double>)local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                }
                ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_428);
                ::std::ios_base::~ios_base((ios_base *)local_4b0->_M_local_buf);
              }
              if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                operator_delete((void *)local_520._M_allocated_capacity,
                                (ulong)((long)local_510.data._0_8_ + 1));
              }
            }
            args = (uint *)pcVar15;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1
                             );
              args = (uint *)pcVar15;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            iVar10 = 0;
            if (((ulong)local_548 & 0xfffffffd) == 0) {
              iVar10 = 3;
LAB_001edf73:
              bVar19 = false;
            }
            else {
              bVar19 = true;
              if (local_548._0_4_ != 1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_428,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_428,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_428,0xabe);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                local_4f0 = (storage_t<double>)local_4e0;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4f0,"Parsing attribute `{}` failed. Error: {}","");
                args = (uint *)&sStack_540;
                fmt::format<char[12],std::__cxx11::string>
                          ((string *)&local_520,(fmt *)&local_4f0,(string *)"doubleSided",
                           (char (*) [12])args,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,(char *)local_520._M_allocated_capacity,
                                     local_520._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                  operator_delete((void *)local_520._M_allocated_capacity,
                                  (ulong)((long)local_510.data._0_8_ + 1));
                }
                uVar18 = local_510._24_8_;
                if (local_4f0 != (storage_t<double>)local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                }
                if ((string *)uVar18 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  psVar12 = (storage_t<double> *)
                            ::std::__cxx11::string::_M_append((char *)&local_4f0,*(ulong *)uVar18);
                  args = (uint *)(psVar12 + 2);
                  if (*psVar12 == (storage_t<double>)args) {
                    local_510.data._0_8_ = (undefined8)*(undefined8 *)args;
                    local_510._8_8_ = psVar12[3];
                    local_520._M_allocated_capacity = (size_type)&local_510;
                  }
                  else {
                    local_510.data._0_8_ = (undefined8)*(undefined8 *)args;
                    local_520._M_allocated_capacity = (size_type)*psVar12;
                  }
                  local_520._8_8_ = psVar12[1];
                  *psVar12 = (storage_t<double>)args;
                  psVar12[1] = (storage_t<double>)0x0;
                  *(undefined1 *)(psVar12 + 2) = 0;
                  ::std::__cxx11::string::operator=
                            ((string *)uVar18,(string *)local_520._M_local_buf);
                  if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity != &local_510) {
                    operator_delete((void *)local_520._M_allocated_capacity,
                                    (ulong)((long)local_510.data._0_8_ + 1));
                  }
                  if (local_4f0 != (storage_t<double>)local_4e0) {
                    operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
                ::std::ios_base::~ios_base(local_3b8);
                iVar10 = 1;
                goto LAB_001edf73;
              }
            }
            if (sStack_540 != (storage_t<double>)&sStack_530) {
              operator_delete((void *)sStack_540,(long)sStack_530 + 1);
            }
            if (bVar19) {
              iVar10 = ::std::__cxx11::string::compare((char *)p_Var1);
              if (iVar10 == 0) {
                local_428.dynamic = local_418;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_428,"visibility","");
                cVar13 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_510._16_8_,(key_type *)&local_428);
                if ((undefined1 *)local_428.dynamic != local_418) {
                  operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                }
                iVar10 = 3;
                if (cVar13._M_node == local_4a8) {
                  if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                    local_428.dynamic = local_418;
                    local_428._8_8_ = 0;
                    local_418._0_8_ = local_418._0_8_ & 0xffffffffffffff00;
                  }
                  else {
                    Attribute::type_name_abi_cxx11_((string *)&local_428,(Attribute *)local_4d0);
                  }
                  psVar3 = local_4c0;
                  local_548 = (storage_t<double>)&local_538;
                  sStack_540 = (storage_t<double>)0x5;
                  local_538._0_6_ = 0x6e656b6f74;
                  if (((local_428._8_8_ == 5) &&
                      (iVar10 = bcmp(local_428.dynamic,&local_538,5), iVar10 == 0)) &&
                     (uVar2 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar2 < 2)) {
                    if ((undefined1 *)local_428.dynamic != local_418) {
                      operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                    }
                    if (uVar2 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"():",3);
                      poVar11 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)&local_428,0xac0);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"visibility",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"` token attribute. Set default token value."
                                 ,0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_428,"\n",1);
                      if (psVar3 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_548,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_520,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_510._24_8_);
                        ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_548);
                        if (local_548 != (storage_t<double>)&local_538) {
                          operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                        }
                        if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity !=
                            &local_510) {
                          operator_delete((void *)local_520._M_allocated_capacity,
                                          (ulong)((long)local_510.data._0_8_ + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
                      ::std::ios_base::~ios_base(local_3b8);
                      AttrMetas::operator=(&local_460->_metas,(AttrMetas *)(p_Var14 + 7));
                      pcVar17 = "visibility";
                      pcVar15 = "";
LAB_001eeeb8:
                      iVar10 = 3;
                      local_428.dynamic = local_418;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_428,pcVar17,pcVar15);
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)local_510._16_8_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_428);
                      sVar16 = (storage_t<double>)local_418._0_8_;
                      uVar18 = local_428.dynamic;
                      iVar8 = 3;
                      if ((undefined1 *)local_428.dynamic != local_418) goto LAB_001ee49d;
                      goto LAB_001ef0ab;
                    }
                  }
                  else if ((undefined1 *)local_428.dynamic != local_418) {
                    operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                  }
                  local_428._8_8_ = 0;
                  local_428.dynamic = VisibilityEnumHandler;
                  local_418._8_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_invoke;
                  local_418._0_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_manager;
                  local_548 = (storage_t<double>)&local_538;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_548,"visibility","");
                  local_48 = (storage_t<double>)0x0;
                  pcStack_40 = (code *)0x0;
                  local_58._M_unused._M_object = (void *)0x0;
                  local_58._8_8_ = 0;
                  if ((storage_t<double>)local_418._0_8_ != (storage_t<double>)0x0) {
                    (*(code *)local_418._0_8_)(&local_58,&local_428,2);
                    local_48 = (storage_t<double>)local_418._0_8_;
                    pcStack_40 = (code *)local_418._8_8_;
                  }
                  args = (uint *)local_4d0;
                  args_1 = local_460;
                  bVar19 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                     ((string *)&local_548,SUB41(local_4c4,0),
                                      (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                      (Attribute *)local_4d0,local_460,psVar3,
                                      (string *)local_510._24_8_);
                  if (local_48 != (storage_t<double>)0x0) {
                    (*(code *)local_48)(&local_58,&local_58,3);
                  }
                  if (local_548 != (storage_t<double>)&local_538) {
                    operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                  }
                  iVar10 = 1;
                  if (bVar19) {
                    AttrMetas::operator=(&local_460->_metas,(AttrMetas *)(p_Var14 + 7));
                    pcVar17 = "visibility";
                    pcVar15 = "";
LAB_001ef05d:
                    local_548 = (storage_t<double>)&local_538;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_548,pcVar17,pcVar15);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_510._16_8_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_548);
                    if (local_548 != (storage_t<double>)&local_538) {
                      operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                    }
                    iVar10 = 3;
                  }
LAB_001ef08c:
                  if ((storage_t<double>)local_418._0_8_ != (storage_t<double>)0x0) {
                    (*(code *)local_418._0_8_)(&local_428,&local_428,3);
                  }
                }
              }
              else {
                iVar10 = ::std::__cxx11::string::compare((char *)p_Var1);
                if (iVar10 == 0) {
                  local_428.dynamic = local_418;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_428,"purpose","");
                  cVar13 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_510._16_8_,(key_type *)&local_428);
                  if ((undefined1 *)local_428.dynamic != local_418) {
                    operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                  }
                  iVar10 = 3;
                  if (cVar13._M_node == local_4a8) {
                    if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                      local_428.dynamic = local_418;
                      local_428._8_8_ = 0;
                      local_418._0_8_ = local_418._0_8_ & 0xffffffffffffff00;
                    }
                    else {
                      Attribute::type_name_abi_cxx11_((string *)&local_428,(Attribute *)local_4d0);
                    }
                    psVar3 = local_4c0;
                    local_548 = (storage_t<double>)&local_538;
                    sStack_540 = (storage_t<double>)0x5;
                    local_538._0_6_ = 0x6e656b6f74;
                    if (((local_428._8_8_ == 5) &&
                        (iVar10 = bcmp(local_428.dynamic,&local_538,5), iVar10 == 0)) &&
                       (uVar2 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar2 < 2)) {
                      if ((undefined1 *)local_428.dynamic != local_418) {
                        operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                      }
                      if (uVar2 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"():",3);
                        poVar11 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)&local_428,0xac2);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"No value assigned to `",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"purpose",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,
                                   "` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"\n",1);
                        if (psVar3 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_548,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_520,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_510._24_8_);
                          ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_548);
                          if (local_548 != (storage_t<double>)&local_538) {
                            operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                          }
                          if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity !=
                              &local_510) {
                            operator_delete((void *)local_520._M_allocated_capacity,
                                            (ulong)((long)local_510.data._0_8_ + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
                        ::std::ios_base::~ios_base(local_3b8);
                        AttrMetas::operator=(&local_468->_metas,(AttrMetas *)(p_Var14 + 7));
                        pcVar17 = "purpose";
                        pcVar15 = "";
                        goto LAB_001eeeb8;
                      }
                    }
                    else if ((undefined1 *)local_428.dynamic != local_418) {
                      operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                    }
                    local_428._8_8_ = 0;
                    local_428.dynamic = PurposeEnumHandler;
                    local_418._8_8_ =
                         ::std::
                         _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         ::_M_invoke;
                    local_418._0_8_ =
                         ::std::
                         _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         ::_M_manager;
                    local_548 = (storage_t<double>)&local_538;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_548,"purpose","");
                    local_68 = (storage_t<double>)0x0;
                    pcStack_60 = (code *)0x0;
                    local_78._M_unused._M_object = (void *)0x0;
                    local_78._8_8_ = 0;
                    if ((storage_t<double>)local_418._0_8_ != (storage_t<double>)0x0) {
                      (*(code *)local_418._0_8_)(&local_78,&local_428,2);
                      local_68 = (storage_t<double>)local_418._0_8_;
                      pcStack_60 = (code *)local_418._8_8_;
                    }
                    args = (uint *)local_4d0;
                    args_1 = local_468;
                    bVar19 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                       ((string *)&local_548,SUB41(local_4c4,0),
                                        (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                        (Attribute *)local_4d0,
                                        (TypedAttributeWithFallback<tinyusdz::Purpose> *)local_468,
                                        psVar3,(string *)local_510._24_8_);
                    if (local_68 != (storage_t<double>)0x0) {
                      (*(code *)local_68)(&local_78,&local_78,3);
                    }
                    if (local_548 != (storage_t<double>)&local_538) {
                      operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                    }
                    iVar10 = 1;
                    if (bVar19) {
                      AttrMetas::operator=(&local_468->_metas,(AttrMetas *)(p_Var14 + 7));
                      pcVar17 = "purpose";
                      pcVar15 = "";
                      goto LAB_001ef05d;
                    }
                    goto LAB_001ef08c;
                  }
                }
                else {
                  iVar10 = ::std::__cxx11::string::compare((char *)p_Var1);
                  if (iVar10 == 0) {
                    local_428.dynamic = local_418;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_428,"orientation","");
                    cVar13 = ::std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_510._16_8_,(key_type *)&local_428);
                    if ((undefined1 *)local_428.dynamic != local_418) {
                      operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                    }
                    iVar10 = 3;
                    if (cVar13._M_node == local_4a8) {
                      if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                        local_428.dynamic = local_418;
                        local_428._8_8_ = 0;
                        local_418._0_8_ = local_418._0_8_ & 0xffffffffffffff00;
                      }
                      else {
                        Attribute::type_name_abi_cxx11_((string *)&local_428,(Attribute *)local_4d0)
                        ;
                      }
                      psVar3 = local_4c0;
                      local_548 = (storage_t<double>)&local_538;
                      sStack_540 = (storage_t<double>)0x5;
                      local_538._0_6_ = 0x6e656b6f74;
                      if (((local_428._8_8_ == 5) &&
                          (iVar10 = bcmp(local_428.dynamic,&local_538,5), iVar10 == 0)) &&
                         (uVar2 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar2 < 2)) {
                        if ((undefined1 *)local_428.dynamic != local_418) {
                          operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                        }
                        if (uVar2 == 0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"[warn]",6);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"():",3);
                          poVar11 = (ostream *)
                                    ::std::ostream::operator<<((ostringstream *)&local_428,0xac4);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"No value assigned to `",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"orientation",0xb);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,
                                     "` token attribute. Set default token value.",0x2b);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_428,"\n",1);
                          if (psVar3 != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_548,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_520,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_510._24_8_);
                            ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_548)
                            ;
                            if (local_548 != (storage_t<double>)&local_538) {
                              operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                            }
                            if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity !=
                                &local_510) {
                              operator_delete((void *)local_520._M_allocated_capacity,
                                              (ulong)((long)local_510.data._0_8_ + 1));
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428)
                          ;
                          ::std::ios_base::~ios_base(local_3b8);
                          AttrMetas::operator=(&local_4a0->_metas,(AttrMetas *)(p_Var14 + 7));
                          pcVar17 = "orientation";
                          pcVar15 = "";
                          goto LAB_001eeeb8;
                        }
                      }
                      else if ((undefined1 *)local_428.dynamic != local_418) {
                        operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                      }
                      local_428._8_8_ = 0;
                      local_428.dynamic = OrientationEnumHandler;
                      local_418._8_8_ =
                           ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_invoke;
                      local_418._0_8_ =
                           ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
                      local_548 = (storage_t<double>)&local_538;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_548,"orientation","");
                      local_88 = (storage_t<double>)0x0;
                      pcStack_80 = (code *)0x0;
                      local_98._M_unused._M_object = (void *)0x0;
                      local_98._8_8_ = 0;
                      if ((storage_t<double>)local_418._0_8_ != (storage_t<double>)0x0) {
                        (*(code *)local_418._0_8_)(&local_98,&local_428,2);
                        local_88 = (storage_t<double>)local_418._0_8_;
                        pcStack_80 = (code *)local_418._8_8_;
                      }
                      args = (uint *)local_4d0;
                      args_1 = local_4a0;
                      bVar19 = ParseUniformEnumProperty<tinyusdz::Orientation,tinyusdz::Orientation>
                                         ((string *)&local_548,SUB41(local_4c4,0),
                                          (EnumHandlerFun<tinyusdz::Orientation> *)&local_98,
                                          (Attribute *)local_4d0,
                                          (TypedAttributeWithFallback<tinyusdz::Orientation> *)
                                          local_4a0,psVar3,(string *)local_510._24_8_);
                      if (local_88 != (storage_t<double>)0x0) {
                        (*(code *)local_88)(&local_98,&local_98,3);
                      }
                      if (local_548 != (storage_t<double>)&local_538) {
                        operator_delete((void *)local_548,(ulong)((long)local_538 + 1));
                      }
                      iVar10 = 1;
                      if (bVar19) {
                        AttrMetas::operator=(&local_4a0->_metas,(AttrMetas *)(p_Var14 + 7));
                        pcVar17 = "orientation";
                        pcVar15 = "";
                        goto LAB_001ef05d;
                      }
                      goto LAB_001ef08c;
                    }
                  }
                  else {
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b8,*(long *)(p_Var14 + 1),
                               (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
                    args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>
                              *)&local_428;
                    local_428.dynamic = local_418;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)args_1,"extent","");
                    args = (uint *)local_4d0;
                    ParseExtentAttribute
                              ((ParseResult *)&local_548,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_510._16_8_,&local_b8,(Property *)local_4d0,(string *)args_1,
                               local_d0);
                    if ((undefined1 *)local_428.dynamic != local_418) {
                      operator_delete(local_428.dynamic,local_418._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      local_b8.field_2._M_allocated_capacity + 1);
                    }
                    if (((ulong)local_548 & 0xfffffffd) == 0) {
                      iVar10 = 3;
                    }
                    else {
                      iVar10 = 0;
                      if (local_548._0_4_ != 1) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"ReconstructGPrimProperties",0x1a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_428,"():",3);
                        poVar11 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)&local_428,0xac5);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                        local_4f0 = (storage_t<double>)local_4e0;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4f0,
                                   "Parsing attribute `extent` failed. Error: {}","");
                        fmt::format<std::__cxx11::string>
                                  ((string *)&local_520,(fmt *)&local_4f0,(string *)&sStack_540,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)args);
                        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_428,
                                             (char *)local_520._M_allocated_capacity,local_520._8_8_
                                            );
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                        if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity !=
                            &local_510) {
                          operator_delete((void *)local_520._M_allocated_capacity,
                                          (ulong)((long)local_510.data._0_8_ + 1));
                        }
                        uVar18 = local_510._24_8_;
                        if (local_4f0 != (storage_t<double>)local_4e0) {
                          operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                        }
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            uVar18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_520,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_4f0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)uVar18);
                          ::std::__cxx11::string::operator=
                                    ((string *)uVar18,(string *)local_520._M_local_buf);
                          if ((storage_t<tinyusdz::Token> *)local_520._M_allocated_capacity !=
                              &local_510) {
                            operator_delete((void *)local_520._M_allocated_capacity,
                                            (ulong)((long)local_510.data._0_8_ + 1));
                          }
                          if (local_4f0 != (storage_t<double>)local_4e0) {
                            operator_delete((void *)local_4f0,(ulong)((long)local_4e0[0] + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
                        ::std::ios_base::~ios_base(local_3b8);
                        iVar10 = 1;
                      }
                    }
                    sVar16 = sStack_530;
                    uVar18 = sStack_540;
                    iVar8 = iVar10;
                    if (sStack_540 != (storage_t<double>)&sStack_530) {
LAB_001ee49d:
                      iVar10 = iVar8;
                      operator_delete((void *)uVar18,(long)sVar16 + 1);
                    }
                  }
                }
              }
            }
          }
LAB_001ef0ab:
          p_Var1 = local_c0;
          if ((iVar10 != 3) && (iVar10 != 0)) {
            return bVar9;
          }
          p_Var14 = (_Base_ptr)::std::_Rb_tree_increment(p_Var14);
          bVar9 = p_Var14 == p_Var1;
          if (bVar9) {
            return bVar9;
          }
        } while( true );
      }
    }
  }
  return false;
switchD_001ecdbe_caseD_1:
  RelationshipProperty::RelationshipProperty((RelationshipProperty *)&local_428,(Relationship *)rel)
  ;
  sVar16 = local_4b8;
  *(undefined1 *)((long)local_4b8 + 0x1660) = local_428._0_1_;
  ((Relationship *)((long)local_4b8 + 0x1668))->type = local_428._8_4_;
  Path::operator=(local_470,(Path *)local_418);
  local_548 = *(storage_t<double> *)((long)sVar16 + 0x1740);
  sStack_540 = *(storage_t<double> *)((long)sVar16 + 0x1748);
  local_538 = *(storage_t<double> *)((long)sVar16 + 0x1750);
  *(undefined8 *)((long)sVar16 + 0x1740) = local_348._0_8_;
  *(undefined8 *)((long)sVar16 + 0x1748) = local_348._8_8_;
  *(undefined8 *)((long)sVar16 + 0x1750) = local_348._16_8_;
  args = (uint *)0x0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_8_ = (pointer)0x0;
  local_348._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_548);
  pAVar4 = local_488;
  *(undefined4 *)((long)sVar16 + 0x1758) = local_348._24_4_;
  AttrMetas::operator=(local_480,local_488);
  *(bool *)((long)sVar16 + 0x1968) = local_120;
  AttrMetas::~AttrMetas(pAVar4);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._16_8_ != local_490) {
    operator_delete((void *)local_388._16_8_,local_368[0]._M_allocated_capacity + 1);
  }
  if (local_398 != local_498) {
    operator_delete((void *)local_398,(long)local_388.data._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != local_4b0) {
    operator_delete((void *)local_3b8._0_8_,local_3a8._M_allocated_capacity + 1);
  }
  if ((storage_t<double> *)local_3d8._M_p != (storage_t<double> *)&local_3c8) {
    operator_delete(local_3d8._M_p,local_3c8._M_allocated_capacity + 1);
  }
  if ((storage_t<double> *)local_408._16_8_ != (storage_t<double> *)&local_3e8) {
    operator_delete((void *)local_408._16_8_,local_3e8._M_allocated_capacity + 1);
  }
  if ((storage_t<double> *)local_418._0_8_ != (storage_t<double> *)local_408) {
    operator_delete((void *)local_418._0_8_,local_408._0_8_ + 1);
  }
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_510._16_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
  iVar10 = 3;
LAB_001edbe4:
  bVar19 = false;
  goto LAB_001edbe6;
}

Assistant:

bool ReconstructGPrimProperties(
  const Specifier &spec,
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  GPrim *gprim, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{

  (void)warn;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &gprim->xformOps, err)) {
    return false;
  }

  if (!prim::ReconstructMaterialBindingProperties(table, properties, gprim, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, gprim, warn, err, strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kProxyPrim, gprim->proxyPrim)
    PARSE_TYPED_ATTRIBUTE(table, prop, "doubleSided", GPrim, gprim->doubleSided)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, GPrim,
                   gprim->visibility, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, GPrim,
                       gprim->purpose, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "orientation", Orientation, OrientationEnumHandler, GPrim,
                       gprim->orientation, strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", GPrim, gprim->extent)
  }

  return true;
}